

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMan.c
# Opt level: O0

Cov_Man_t * Cov_ManAlloc(Abc_Ntk_t *pNtk,int nFaninMax,int nCubesMax)

{
  int iVar1;
  Cov_Man_t *__s;
  Vec_Int_t *pVVar2;
  void *__s_00;
  Vec_Ptr_t *pVVar3;
  Abc_Obj_t *pAVar4;
  Min_Man_t *pMVar5;
  int local_34;
  int i;
  Abc_Obj_t *pObj;
  Cov_Obj_t *pMem;
  Cov_Man_t *pMan;
  int nCubesMax_local;
  int nFaninMax_local;
  Abc_Ntk_t *pNtk_local;
  
  if (pNtk->pManCut == (void *)0x0) {
    __s = (Cov_Man_t *)malloc(0x78);
    memset(__s,0,0x78);
    __s->nFaninMax = nFaninMax;
    __s->nCubesMax = nCubesMax;
    iVar1 = Abc_BitWordNum(nFaninMax << 1);
    __s->nWords = iVar1;
    pVVar2 = Vec_IntAlloc(nFaninMax << 1);
    __s->vComTo0 = pVVar2;
    pVVar2 = Vec_IntAlloc(nFaninMax << 1);
    __s->vComTo1 = pVVar2;
    pVVar2 = Vec_IntAlloc(nFaninMax);
    __s->vPairs0 = pVVar2;
    pVVar2 = Vec_IntAlloc(nFaninMax);
    __s->vPairs1 = pVVar2;
    pVVar2 = Vec_IntAlloc(1);
    __s->vTriv0 = pVVar2;
    Vec_IntPush(__s->vTriv0,-1);
    pVVar2 = Vec_IntAlloc(1);
    __s->vTriv1 = pVVar2;
    Vec_IntPush(__s->vTriv1,-1);
    iVar1 = Abc_NtkObjNumMax(pNtk);
    __s_00 = malloc((long)iVar1 << 10);
    __s->pMemory = __s_00;
    iVar1 = Abc_NtkObjNumMax(pNtk);
    memset(__s_00,0,(long)iVar1 << 5);
    iVar1 = Abc_NtkObjNumMax(pNtk);
    pVVar3 = Vec_PtrAlloc(iVar1);
    __s->vObjStrs = pVVar3;
    pVVar3 = __s->vObjStrs;
    iVar1 = Abc_NtkObjNumMax(pNtk);
    Vec_PtrFill(pVVar3,iVar1,(void *)0x0);
    for (local_34 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_34 < iVar1; local_34 = local_34 + 1)
    {
      pAVar4 = Abc_NtkObj(pNtk,local_34);
      if (pAVar4 != (Abc_Obj_t *)0x0) {
        Vec_PtrWriteEntry(__s->vObjStrs,local_34,(void *)((long)__s_00 + (long)local_34 * 0x20));
      }
    }
    pMVar5 = Min_ManAlloc(nFaninMax);
    __s->pManMin = pMVar5;
    return __s;
  }
  __assert_fail("pNtk->pManCut == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/cov/covMan.c"
                ,0x33,"Cov_Man_t *Cov_ManAlloc(Abc_Ntk_t *, int, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Cov_Man_t * Cov_ManAlloc( Abc_Ntk_t * pNtk, int nFaninMax, int nCubesMax )
{
    Cov_Man_t * pMan;
    Cov_Obj_t * pMem;
    Abc_Obj_t * pObj;
    int i;
    assert( pNtk->pManCut == NULL );

    // start the manager
    pMan = ABC_ALLOC( Cov_Man_t, 1 );
    memset( pMan, 0, sizeof(Cov_Man_t) );
    pMan->nFaninMax = nFaninMax;
    pMan->nCubesMax = nCubesMax;
    pMan->nWords    = Abc_BitWordNum( nFaninMax * 2 );

    // get the cubes
    pMan->vComTo0 = Vec_IntAlloc( 2*nFaninMax );
    pMan->vComTo1 = Vec_IntAlloc( 2*nFaninMax );
    pMan->vPairs0 = Vec_IntAlloc( nFaninMax );
    pMan->vPairs1 = Vec_IntAlloc( nFaninMax );
    pMan->vTriv0  = Vec_IntAlloc( 1 );  Vec_IntPush( pMan->vTriv0, -1 ); 
    pMan->vTriv1  = Vec_IntAlloc( 1 );  Vec_IntPush( pMan->vTriv1, -1 ); 

    // allocate memory for object structures
    pMan->pMemory = pMem = ABC_ALLOC( Cov_Obj_t, sizeof(Cov_Obj_t) * Abc_NtkObjNumMax(pNtk) );
    memset( pMem, 0, sizeof(Cov_Obj_t) * Abc_NtkObjNumMax(pNtk) );
    // allocate storage for the pointers to the memory
    pMan->vObjStrs = Vec_PtrAlloc( Abc_NtkObjNumMax(pNtk) );
    Vec_PtrFill( pMan->vObjStrs, Abc_NtkObjNumMax(pNtk), NULL );
    Abc_NtkForEachObj( pNtk, pObj, i )
        Vec_PtrWriteEntry( pMan->vObjStrs, i, pMem + i );
    // create the cube manager
    pMan->pManMin = Min_ManAlloc( nFaninMax );
    return pMan;
}